

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int header_get_ttl(HEADER_HANDLE header,milliseconds *ttl_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  HEADER_INSTANCE *header_instance;
  uint32_t item_count;
  int result;
  milliseconds *ttl_value_local;
  HEADER_HANDLE header_local;
  
  if (header == (HEADER_HANDLE)0x0) {
    header_instance._4_4_ = 0x3a7d;
  }
  else {
    _item_count = ttl_value;
    ttl_value_local = (milliseconds *)header;
    iVar1 = amqpvalue_get_composite_item_count(header->composite_value,(uint32_t *)&header_instance)
    ;
    if (iVar1 == 0) {
      if ((uint)header_instance < 3) {
        header_instance._4_4_ = 0x3a8b;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(header->composite_value,2);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          header_instance._4_4_ = 0x3a93;
        }
        else {
          iVar1 = amqpvalue_get_uint(value,_item_count);
          if (iVar1 == 0) {
            header_instance._4_4_ = 0;
          }
          else {
            header_instance._4_4_ = 0x3a9a;
          }
        }
      }
    }
    else {
      header_instance._4_4_ = 0x3a85;
    }
  }
  return header_instance._4_4_;
}

Assistant:

int header_get_ttl(HEADER_HANDLE header, milliseconds* ttl_value)
{
    int result;

    if (header == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        HEADER_INSTANCE* header_instance = (HEADER_INSTANCE*)header;
        if (amqpvalue_get_composite_item_count(header_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 2)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(header_instance->composite_value, 2);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_milliseconds(item_value, ttl_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}